

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O3

bool GetScriptOp(const_iterator *pc,const_iterator end,opcodetype *opcodeRet,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *pvchRet)

{
  byte bVar1;
  long lVar2;
  pointer puVar3;
  byte *pbVar4;
  bool bVar5;
  const_iterator copy;
  byte *pbVar6;
  int iVar7;
  opcodetype oVar8;
  opcodetype oVar9;
  int iVar10;
  opcodetype oVar11;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *opcodeRet = OP_INVALIDOPCODE;
  if ((pvchRet != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) &&
     (puVar3 = (pvchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
     (pvchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
     super__Vector_impl_data._M_finish != puVar3)) {
    (pvchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  pbVar4 = pc->ptr;
  if ((end.ptr <= pbVar4) || (iVar10 = (int)end.ptr, iVar10 - (int)pbVar4 < 1)) goto LAB_00830829;
  pbVar6 = pbVar4 + 1;
  pc->ptr = pbVar6;
  bVar1 = *pbVar4;
  oVar9 = (opcodetype)bVar1;
  if (bVar1 < 0x4f) {
    oVar8 = oVar9;
    if (0x4b < bVar1) {
      iVar7 = iVar10 - (int)pbVar6;
      if (bVar1 == 0x4d) {
        if (1 < iVar7) {
          oVar8 = (opcodetype)*(ushort *)(pbVar4 + 1);
          pbVar6 = pbVar4 + 3;
LAB_00830834:
          pc->ptr = pbVar6;
          goto LAB_0083083a;
        }
      }
      else if (oVar9 == OP_PUSHDATA1) {
        if (0 < iVar7) {
          pbVar6 = pbVar4 + 2;
          pc->ptr = pbVar6;
          oVar8 = (uint)pbVar4[1];
          goto LAB_0083083a;
        }
      }
      else if (3 < iVar7) {
        oVar8 = *(opcodetype *)(pbVar4 + 1);
        pbVar6 = pbVar4 + 5;
        goto LAB_00830834;
      }
LAB_00830829:
      bVar5 = false;
      goto LAB_00830869;
    }
LAB_0083083a:
    oVar11 = iVar10 - (int)pbVar6;
    bVar5 = false;
    if (((int)oVar11 < 0) || (bVar5 = false, oVar11 < oVar8)) goto LAB_00830869;
    if (pvchRet != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_assign_aux<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)pvchRet,pbVar6,
                 pbVar6 + oVar8);
      pbVar6 = pc->ptr;
    }
    pc->ptr = pbVar6 + oVar8;
  }
  *opcodeRet = oVar9;
  bVar5 = true;
LAB_00830869:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool GetScriptOp(CScriptBase::const_iterator& pc, CScriptBase::const_iterator end, opcodetype& opcodeRet, std::vector<unsigned char>* pvchRet)
{
    opcodeRet = OP_INVALIDOPCODE;
    if (pvchRet)
        pvchRet->clear();
    if (pc >= end)
        return false;

    // Read instruction
    if (end - pc < 1)
        return false;
    unsigned int opcode = *pc++;

    // Immediate operand
    if (opcode <= OP_PUSHDATA4)
    {
        unsigned int nSize = 0;
        if (opcode < OP_PUSHDATA1)
        {
            nSize = opcode;
        }
        else if (opcode == OP_PUSHDATA1)
        {
            if (end - pc < 1)
                return false;
            nSize = *pc++;
        }
        else if (opcode == OP_PUSHDATA2)
        {
            if (end - pc < 2)
                return false;
            nSize = ReadLE16(&pc[0]);
            pc += 2;
        }
        else if (opcode == OP_PUSHDATA4)
        {
            if (end - pc < 4)
                return false;
            nSize = ReadLE32(&pc[0]);
            pc += 4;
        }
        if (end - pc < 0 || (unsigned int)(end - pc) < nSize)
            return false;
        if (pvchRet)
            pvchRet->assign(pc, pc + nSize);
        pc += nSize;
    }

    opcodeRet = static_cast<opcodetype>(opcode);
    return true;
}